

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::
RemoveCurrent<Memory::ArenaAllocator>(EditingIterator *this,ArenaAllocator *allocator)

{
  DListNode<Memory::CustomHeap::Page> *obj;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<Memory::CustomHeap::Page> *pDVar4;
  NodeBase *node;
  NodeBase *last;
  ArenaAllocator *allocator_local;
  EditingIterator *this_local;
  
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DListBase<Memory::CustomHeap::Page,_RealCount>::IsHead
                    ((this->super_Iterator).list,(this->super_Iterator).current);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar4 = DListNodeBase<Memory::CustomHeap::Page>::Prev((this->super_Iterator).current);
  obj = (DListNode<Memory::CustomHeap::Page> *)(this->super_Iterator).current;
  DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveNode((NodeBase *)obj);
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::CustomHeap::Page>>
            (allocator,obj);
  (this->super_Iterator).current = pDVar4;
  RealCount::DecrementCount(&((this->super_Iterator).list)->super_RealCount);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }